

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O2

Mat * ncnn::Mat::from_pixels
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int stride,
                Allocator *allocator)

{
  ulong uVar1;
  size_t sVar2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  float *pfVar7;
  int iVar8;
  int iVar9;
  float *pfVar10;
  void *pvVar11;
  float *pfVar12;
  void *pvVar13;
  byte *pbVar14;
  long lVar15;
  float *pfVar16;
  void *pvVar17;
  int remain_1;
  int remain_5;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  Mat m;
  
  __return_storage_ptr__->cstep = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->d = 0;
  __return_storage_ptr__->c = 0;
  if ((uint)type < 0x10000) {
    if (type - 1U < 2) {
      from_rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
    }
    else if (type == 3) {
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar7 = (float *)__return_storage_ptr__->data;
      if (pfVar7 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar8 = 0;
      iVar19 = 0;
      if (0 < h) {
        iVar19 = h;
      }
      iVar9 = 1;
      if (stride - w == 0) {
        iVar19 = 1;
        iVar9 = h;
      }
      pbVar14 = pixels;
      for (; iVar20 = iVar9 * w, iVar8 != iVar19; iVar8 = iVar8 + 1) {
        for (; 0 < iVar20; iVar20 = iVar20 + -1) {
          *pfVar7 = (float)*pbVar14;
          pbVar14 = pbVar14 + 1;
          pfVar7 = pfVar7 + 1;
        }
        pbVar14 = pbVar14 + (stride - w);
      }
    }
    if ((type & 0xfffeU) != 4) {
      return __return_storage_ptr__;
    }
    create(__return_storage_ptr__,w,h,4,4,allocator);
    pfVar7 = (float *)__return_storage_ptr__->data;
    if (pfVar7 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar8 = 0;
    iVar19 = 0;
    if (0 < h) {
      iVar19 = h;
    }
    iVar20 = stride + w * -4;
    iVar9 = 1;
    if (iVar20 == 0) {
      iVar19 = iVar9;
      iVar9 = h;
    }
    lVar15 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
    pfVar10 = (float *)((long)pfVar7 + lVar15);
    pfVar12 = (float *)((long)pfVar7 + lVar15 * 2);
    pfVar16 = (float *)(lVar15 * 3 + (long)pfVar7);
    for (; iVar18 = iVar9 * w, iVar8 != iVar19; iVar8 = iVar8 + 1) {
      for (; 0 < iVar18; iVar18 = iVar18 + -1) {
        *pfVar7 = (float)*pixels;
        *pfVar10 = (float)pixels[1];
        *pfVar12 = (float)pixels[2];
        *pfVar16 = (float)pixels[3];
        pixels = pixels + 4;
        pfVar7 = pfVar7 + 1;
        pfVar10 = pfVar10 + 1;
        pfVar12 = pfVar12 + 1;
        pfVar16 = pfVar16 + 1;
      }
      pixels = pixels + iVar20;
    }
    return __return_storage_ptr__;
  }
  switch(type) {
  case 0x10002:
switchD_0015eed0_caseD_20001:
    from_rgb2bgr(pixels,w,h,stride,__return_storage_ptr__,allocator);
    return __return_storage_ptr__;
  case 0x10003:
switchD_0015eed0_caseD_20003:
    from_gray2rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
    return __return_storage_ptr__;
  case 0x10004:
switchD_0015eed0_caseD_20005:
    create(__return_storage_ptr__,w,h,3,4,allocator);
    pfVar7 = (float *)__return_storage_ptr__->data;
    if (pfVar7 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar8 = 0;
    iVar19 = 0;
    if (0 < h) {
      iVar19 = h;
    }
    iVar20 = stride + w * -4;
    iVar9 = 1;
    if (iVar20 == 0) {
      iVar19 = iVar9;
      iVar9 = h;
    }
    lVar15 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
    pfVar10 = (float *)((long)pfVar7 + lVar15);
    pfVar12 = (float *)((long)pfVar7 + lVar15 * 2);
    for (; iVar18 = iVar9 * w, iVar8 != iVar19; iVar8 = iVar8 + 1) {
      for (; 0 < iVar18; iVar18 = iVar18 + -1) {
        *pfVar7 = (float)*pixels;
        *pfVar10 = (float)pixels[1];
        *pfVar12 = (float)pixels[2];
        pixels = pixels + 4;
        pfVar7 = pfVar7 + 1;
        pfVar10 = pfVar10 + 1;
        pfVar12 = pfVar12 + 1;
      }
      pixels = pixels + iVar20;
    }
    return __return_storage_ptr__;
  case 0x10005:
switchD_0015eed0_caseD_20004:
    create(__return_storage_ptr__,w,h,3,4,allocator);
    pfVar7 = (float *)__return_storage_ptr__->data;
    if (pfVar7 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar8 = 0;
    iVar19 = 0;
    if (0 < h) {
      iVar19 = h;
    }
    iVar20 = stride + w * -4;
    iVar9 = 1;
    if (iVar20 == 0) {
      iVar19 = iVar9;
      iVar9 = h;
    }
    lVar15 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
    pfVar10 = (float *)((long)pfVar7 + lVar15);
    pfVar12 = (float *)((long)pfVar7 + lVar15 * 2);
    for (; iVar18 = iVar9 * w, iVar8 != iVar19; iVar8 = iVar8 + 1) {
      for (; 0 < iVar18; iVar18 = iVar18 + -1) {
        *pfVar7 = (float)pixels[2];
        *pfVar10 = (float)pixels[1];
        *pfVar12 = (float)*pixels;
        pixels = pixels + 4;
        pfVar7 = pfVar7 + 1;
        pfVar10 = pfVar10 + 1;
        pfVar12 = pfVar12 + 1;
      }
      pixels = pixels + iVar20;
    }
    return __return_storage_ptr__;
  }
  switch(type) {
  case 0x20001:
    goto switchD_0015eed0_caseD_20001;
  case 0x20002:
switchD_0015ed2d_default:
    fprintf(_stderr,"unimplemented convert type %d",(ulong)(uint)type);
    fputc(10,_stderr);
    return __return_storage_ptr__;
  case 0x20003:
    goto switchD_0015eed0_caseD_20003;
  case 0x20004:
    goto switchD_0015eed0_caseD_20004;
  case 0x20005:
    goto switchD_0015eed0_caseD_20005;
  }
  switch(type) {
  case 0x30001:
    iVar19 = 1;
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar7 = (float *)__return_storage_ptr__->data;
    if ((pfVar7 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar20 = w * -3 + stride;
      iVar9 = 0;
      iVar8 = 0;
      if (0 < h) {
        iVar8 = h;
      }
      if (iVar20 == 0) {
        iVar8 = iVar19;
        iVar19 = h;
      }
      for (; iVar18 = iVar19 * w, iVar9 != iVar8; iVar9 = iVar9 + 1) {
        for (; 0 < iVar18; iVar18 = iVar18 + -1) {
          *pfVar7 = (float)((uint)pixels[2] * 0x1d + (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d
                           >> 8);
          pixels = pixels + 3;
          pfVar7 = pfVar7 + 1;
        }
        pixels = pixels + iVar20;
      }
    }
    break;
  case 0x30002:
    iVar19 = 1;
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar7 = (float *)__return_storage_ptr__->data;
    if ((pfVar7 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar20 = w * -3 + stride;
      iVar9 = 0;
      iVar8 = 0;
      if (0 < h) {
        iVar8 = h;
      }
      if (iVar20 == 0) {
        iVar8 = iVar19;
        iVar19 = h;
      }
      for (; iVar18 = iVar19 * w, iVar9 != iVar8; iVar9 = iVar9 + 1) {
        for (; 0 < iVar18; iVar18 = iVar18 + -1) {
          *pfVar7 = (float)((uint)*pixels * 0x1d + (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d
                           >> 8);
          pixels = pixels + 3;
          pfVar7 = pfVar7 + 1;
        }
        pixels = pixels + iVar20;
      }
    }
    break;
  case 0x30003:
    goto switchD_0015ed2d_default;
  case 0x30004:
    iVar19 = 1;
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar7 = (float *)__return_storage_ptr__->data;
    if ((pfVar7 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar9 = 0;
      iVar8 = 0;
      if (0 < h) {
        iVar8 = h;
      }
      iVar20 = stride + w * -4;
      if (iVar20 == 0) {
        iVar8 = iVar19;
        iVar19 = h;
      }
      for (; iVar18 = iVar19 * w, iVar9 != iVar8; iVar9 = iVar9 + 1) {
        for (; 0 < iVar18; iVar18 = iVar18 + -1) {
          *pfVar7 = (float)((uint)pixels[2] * 0x1d + (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d
                           >> 8);
          pixels = pixels + 4;
          pfVar7 = pfVar7 + 1;
        }
        pixels = pixels + iVar20;
      }
    }
    break;
  case 0x30005:
    iVar19 = 1;
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar7 = (float *)__return_storage_ptr__->data;
    if ((pfVar7 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar9 = 0;
      iVar8 = 0;
      if (0 < h) {
        iVar8 = h;
      }
      iVar20 = stride + w * -4;
      if (iVar20 == 0) {
        iVar8 = iVar19;
        iVar19 = h;
      }
      for (; iVar18 = iVar19 * w, iVar9 != iVar8; iVar9 = iVar9 + 1) {
        for (; 0 < iVar18; iVar18 = iVar18 + -1) {
          *pfVar7 = (float)((uint)*pixels * 0x1d + (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d
                           >> 8);
          pixels = pixels + 4;
          pfVar7 = pfVar7 + 1;
        }
        pixels = pixels + iVar20;
      }
    }
    break;
  default:
    switch(type) {
    case 0x40001:
switchD_0015ed2d_caseD_50002:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      m.data = __return_storage_ptr__->data;
      if (m.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      m.w = __return_storage_ptr__->w;
      m.h = __return_storage_ptr__->h;
      m.d = __return_storage_ptr__->d;
      m.elemsize = __return_storage_ptr__->elemsize;
      m.elempack = __return_storage_ptr__->elempack;
      m.allocator = __return_storage_ptr__->allocator;
      m.refcount = (int *)0x0;
      m.c = 3;
      uVar21 = 0;
      m.cstep = ((long)m.d * m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                m.elemsize;
      m.dims = __return_storage_ptr__->dims;
      from_rgb(pixels,w,h,stride,&m,allocator);
      lVar15 = (long)__return_storage_ptr__->h * (long)__return_storage_ptr__->w;
      uVar1 = __return_storage_ptr__->elemsize;
      sVar2 = __return_storage_ptr__->cstep;
      pvVar4 = __return_storage_ptr__->data;
      uVar5 = uVar1 * lVar15 + 0xf & 0xfffffffffffffff0;
      iVar19 = (int)(uVar5 / uVar1);
      if (__return_storage_ptr__->dims == 4) {
        iVar19 = (int)lVar15;
      }
      uVar3 = iVar19 * __return_storage_ptr__->d;
      uVar6 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar6 = uVar21;
      }
      for (; (int)uVar6 != (int)uVar21; uVar21 = uVar21 + 1) {
        *(undefined4 *)((long)pvVar4 + uVar21 * 4 + sVar2 * uVar1 * 3) = 0x437f0000;
      }
      if (m.refcount == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *m.refcount = *m.refcount + -1;
      UNLOCK();
      if (*m.refcount != 0) {
        return __return_storage_ptr__;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])(m.allocator,m.data,uVar5 % uVar1);
        return __return_storage_ptr__;
      }
      break;
    case 0x40002:
switchD_0015ed2d_caseD_50001:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      m.data = __return_storage_ptr__->data;
      if (m.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      m.w = __return_storage_ptr__->w;
      m.h = __return_storage_ptr__->h;
      m.d = __return_storage_ptr__->d;
      m.elemsize = __return_storage_ptr__->elemsize;
      m.elempack = __return_storage_ptr__->elempack;
      m.allocator = __return_storage_ptr__->allocator;
      m.refcount = (int *)0x0;
      m.c = 3;
      uVar21 = 0;
      m.cstep = ((long)m.d * m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                m.elemsize;
      m.dims = __return_storage_ptr__->dims;
      from_rgb2bgr(pixels,w,h,stride,&m,allocator);
      lVar15 = (long)__return_storage_ptr__->h * (long)__return_storage_ptr__->w;
      uVar1 = __return_storage_ptr__->elemsize;
      sVar2 = __return_storage_ptr__->cstep;
      pvVar4 = __return_storage_ptr__->data;
      uVar5 = uVar1 * lVar15 + 0xf & 0xfffffffffffffff0;
      iVar19 = (int)(uVar5 / uVar1);
      if (__return_storage_ptr__->dims == 4) {
        iVar19 = (int)lVar15;
      }
      uVar3 = iVar19 * __return_storage_ptr__->d;
      uVar6 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar6 = uVar21;
      }
      for (; (int)uVar6 != (int)uVar21; uVar21 = uVar21 + 1) {
        *(undefined4 *)((long)pvVar4 + uVar21 * 4 + sVar2 * uVar1 * 3) = 0x437f0000;
      }
      if (m.refcount == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *m.refcount = *m.refcount + -1;
      UNLOCK();
      if (*m.refcount != 0) {
        return __return_storage_ptr__;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])(m.allocator,m.data,uVar5 % uVar1);
        return __return_storage_ptr__;
      }
      break;
    case 0x40003:
switchD_0015ed2d_caseD_50003:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      m.data = __return_storage_ptr__->data;
      if (m.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      m.w = __return_storage_ptr__->w;
      m.h = __return_storage_ptr__->h;
      m.d = __return_storage_ptr__->d;
      m.elemsize = __return_storage_ptr__->elemsize;
      m.elempack = __return_storage_ptr__->elempack;
      m.allocator = __return_storage_ptr__->allocator;
      m.refcount = (int *)0x0;
      m.c = 3;
      uVar21 = 0;
      m.cstep = ((long)m.d * m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                m.elemsize;
      m.dims = __return_storage_ptr__->dims;
      from_gray2rgb(pixels,w,h,stride,&m,allocator);
      lVar15 = (long)__return_storage_ptr__->h * (long)__return_storage_ptr__->w;
      uVar1 = __return_storage_ptr__->elemsize;
      sVar2 = __return_storage_ptr__->cstep;
      pvVar4 = __return_storage_ptr__->data;
      uVar5 = uVar1 * lVar15 + 0xf & 0xfffffffffffffff0;
      iVar19 = (int)(uVar5 / uVar1);
      if (__return_storage_ptr__->dims == 4) {
        iVar19 = (int)lVar15;
      }
      uVar3 = iVar19 * __return_storage_ptr__->d;
      uVar6 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar6 = uVar21;
      }
      for (; (int)uVar6 != (int)uVar21; uVar21 = uVar21 + 1) {
        *(undefined4 *)((long)pvVar4 + uVar21 * 4 + sVar2 * uVar1 * 3) = 0x437f0000;
      }
      if (m.refcount == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *m.refcount = *m.refcount + -1;
      UNLOCK();
      if (*m.refcount != 0) {
        return __return_storage_ptr__;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])(m.allocator,m.data,uVar5 % uVar1);
        return __return_storage_ptr__;
      }
      break;
    case 0x40004:
      goto switchD_0015ed2d_default;
    case 0x40005:
switchD_0015ed2d_caseD_50004:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      pvVar4 = __return_storage_ptr__->data;
      if (pvVar4 == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar8 = 0;
      iVar19 = 0;
      if (0 < h) {
        iVar19 = h;
      }
      iVar20 = stride + w * -4;
      iVar9 = 1;
      if (iVar20 == 0) {
        iVar19 = iVar9;
        iVar9 = h;
      }
      lVar15 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      pvVar11 = (void *)((long)pvVar4 + lVar15);
      pvVar13 = (void *)((long)pvVar4 + lVar15 * 2);
      pvVar17 = (void *)(lVar15 * 3 + (long)pvVar4);
      for (; iVar8 != iVar19; iVar8 = iVar8 + 1) {
        lVar15 = 0;
        for (iVar18 = iVar9 * w; 0 < iVar18; iVar18 = iVar18 + -1) {
          *(float *)((long)pvVar4 + lVar15) = (float)pixels[lVar15 + 2];
          *(float *)((long)pvVar11 + lVar15) = (float)pixels[lVar15 + 1];
          *(float *)((long)pvVar13 + lVar15) = (float)pixels[lVar15];
          *(float *)((long)pvVar17 + lVar15) = (float)pixels[lVar15 + 3];
          lVar15 = lVar15 + 4;
        }
        pixels = pixels + lVar15 + iVar20;
        pvVar4 = (void *)((long)pvVar4 + lVar15);
        pvVar11 = (void *)((long)pvVar11 + lVar15);
        pvVar13 = (void *)((long)pvVar13 + lVar15);
        pvVar17 = (void *)((long)pvVar17 + lVar15);
      }
      return __return_storage_ptr__;
    default:
      switch(type) {
      case 0x50001:
        goto switchD_0015ed2d_caseD_50001;
      case 0x50002:
        goto switchD_0015ed2d_caseD_50002;
      case 0x50003:
        goto switchD_0015ed2d_caseD_50003;
      case 0x50004:
        goto switchD_0015ed2d_caseD_50004;
      default:
        goto switchD_0015ed2d_default;
      }
    }
    free(m.data);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels(const unsigned char* pixels, int type, int w, int h, int stride, Allocator* allocator)
{
    Mat m;

    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            from_rgb2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2GRAY:
            from_rgb2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2RGBA:
        case PIXEL_BGR2BGRA:
            from_rgb2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2GRAY:
            from_bgr2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2RGBA:
        case PIXEL_RGB2BGRA:
            from_bgr2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGB:
        case PIXEL_GRAY2BGR:
            from_gray2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGBA:
        case PIXEL_GRAY2BGRA:
            from_gray2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2RGB:
        case PIXEL_BGRA2BGR:
            from_rgba2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGR:
        case PIXEL_BGRA2RGB:
            from_rgba2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2GRAY:
            from_rgba2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGRA:
        case PIXEL_BGRA2RGBA:
            from_rgba2bgra(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGRA2GRAY:
            from_bgra2gray(pixels, w, h, stride, m, allocator);
            break;
        default:
            // unimplemented convert type
            NCNN_LOGE("unimplemented convert type %d", type);
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            from_rgb(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_GRAY)
            from_gray(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_RGBA || type == PIXEL_BGRA)
            from_rgba(pixels, w, h, stride, m, allocator);
    }

    return m;
}